

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

XMLSize_t xercesc_4_0::XMLString::replaceTokens
                    (XMLCh *errText,XMLSize_t maxChars,XMLCh *text1,XMLCh *text2,XMLCh *text3,
                    XMLCh *text4,MemoryManager *manager)

{
  short sVar1;
  XMLCh *pXVar2;
  XMLCh *local_70;
  XMLCh *repText;
  ulong uStack_60;
  XMLCh tokCh;
  XMLSize_t curOutInd;
  XMLCh *pszSrc;
  ArrayJanitor<char16_t> janText;
  XMLCh *orgText;
  XMLCh *text4_local;
  XMLCh *text3_local;
  XMLCh *text2_local;
  XMLCh *text1_local;
  XMLSize_t maxChars_local;
  XMLCh *errText_local;
  
  janText.fMemoryManager = (MemoryManager *)replicate(errText,manager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&pszSrc,(char16_t *)janText.fMemoryManager,manager);
  curOutInd = (XMLSize_t)janText.fMemoryManager;
  uStack_60 = 0;
  while (*(short *)curOutInd != 0 && uStack_60 < maxChars) {
    while ((*(short *)curOutInd != 0x7b && uStack_60 < maxChars && (*(short *)curOutInd != 0))) {
      errText[uStack_60] = *(XMLCh *)curOutInd;
      uStack_60 = uStack_60 + 1;
      curOutInd = curOutInd + 2;
    }
    if (*(short *)curOutInd != 0x7b) break;
    if (((*(ushort *)(curOutInd + 2) < 0x30) || (0x33 < *(ushort *)(curOutInd + 2))) ||
       (*(short *)(curOutInd + 4) != 0x7d)) {
      errText[uStack_60] = *(XMLCh *)curOutInd;
      uStack_60 = uStack_60 + 1;
      curOutInd = curOutInd + 2;
    }
    else {
      sVar1 = *(short *)(curOutInd + 2);
      curOutInd = curOutInd + 6;
      local_70 = (XMLCh *)0x0;
      pXVar2 = text1;
      if (((sVar1 != 0x30) && (pXVar2 = text2, sVar1 != 0x31)) &&
         ((pXVar2 = text3, sVar1 != 0x32 && (pXVar2 = local_70, sVar1 == 0x33)))) {
        pXVar2 = text4;
      }
      local_70 = pXVar2;
      if (local_70 == (XMLCh *)0x0) {
        local_70 = &gNullStr;
      }
      while (*local_70 != L'\0' && uStack_60 < maxChars) {
        errText[uStack_60] = *local_70;
        local_70 = local_70 + 1;
        uStack_60 = uStack_60 + 1;
      }
    }
  }
  errText[uStack_60] = L'\0';
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&pszSrc);
  return uStack_60;
}

Assistant:

XMLSize_t XMLString::replaceTokens(          XMLCh* const    errText
                                        , const XMLSize_t       maxChars
                                        , const XMLCh* const    text1
                                        , const XMLCh* const    text2
                                        , const XMLCh* const    text3
                                        , const XMLCh* const    text4
                                        , MemoryManager* const  manager)
{
    //
    //  We have to build the string back into the source string, so allocate
    //  a temp string and copy the orignal text to it. We'll then treat the
    //  incoming buffer as a target buffer. Put a janitor on it to make sure
    //  it gets cleaned up.
    //
    XMLCh* orgText = replicate(errText, manager);
    ArrayJanitor<XMLCh> janText(orgText, manager);

    XMLCh* pszSrc = orgText;
    XMLSize_t curOutInd = 0;

    while (*pszSrc && (curOutInd < maxChars))
    {
        //
        //  Loop until we see a { character. Until we do, just copy chars
        //  from src to target, being sure not to overrun the output buffer.
        //
        while ((*pszSrc != chOpenCurly) && (curOutInd < maxChars))
        {
            if (!*pszSrc)
                break;
            errText[curOutInd++] = *pszSrc++;
        }

        // If we did not find a curly, then we are done
        if (*pszSrc != chOpenCurly)
            break;

        //
        //  Probe this one to see if it matches our pattern of {x}. If not
        //  then copy over those chars and go back to the first loop.
        //
        if ((*(pszSrc+1) >= chDigit_0)
        &&  (*(pszSrc+1) <= chDigit_3)
        &&  (*(pszSrc+2) == chCloseCurly))
        {
            //
            //  Its one of our guys, so move the source pointer up past the
            //  token we are replacing. First though get out the token number
            //  character.
            //
            XMLCh tokCh = *(pszSrc+1);
            pszSrc += 3;

            // Now copy over the replacement text
            const XMLCh* repText = 0;
            if (tokCh == chDigit_0)
                repText = text1;
            else if (tokCh == chDigit_1)
                repText = text2;
            else if (tokCh == chDigit_2)
                repText = text3;
            else if (tokCh == chDigit_3)
                repText = text4;

            // If this one is null, copy over a null string
            if (!repText)
                repText = gNullStr;

            while (*repText && (curOutInd < maxChars))
                errText[curOutInd++] = *repText++;
        }
         else
        {
            // Escape the curly brace character and continue
            errText[curOutInd++] = *pszSrc++;
        }
    }

    // Copy over a null terminator
    errText[curOutInd] = 0;

    // And return the count of chars we output
    return curOutInd;
}